

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer
          (DeviceContextVkImpl *this,SoftwareQueueIndex CmdQueue,VkCommandBuffer vkCmdBuff,
          Uint64 FenceValue)

{
  Char *pCVar1;
  RenderDeviceVkImpl *this_00;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_01;
  CmdBufferRecycler local_98;
  uchar local_81;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *local_80;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *ReleaseQueue;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Uint64 FenceValue_local;
  VkCommandBuffer vkCmdBuff_local;
  DeviceContextVkImpl *this_local;
  SoftwareQueueIndex CmdQueue_local;
  
  msg.field_2._8_8_ = FenceValue;
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    FormatString<char[26],char[28]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkCmdBuff != VK_NULL_HANDLE",(char (*) [28])FenceValue);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    FenceValue = 0xd9;
    DebugAssertionFailed
              (pCVar1,"DisposeVkCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd9);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (this->m_CmdPool == (VulkanCommandBufferPool *)0x0) {
    FormatString<char[26],char[21]>
              ((string *)&ReleaseQueue,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_CmdPool != nullptr",(char (*) [21])FenceValue);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"DisposeVkCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xda);
    std::__cxx11::string::~string((string *)&ReleaseQueue);
  }
  this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  local_81 = CmdQueue.m_Value;
  this_01 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&this_00->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,CmdQueue);
  local_80 = this_01;
  DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::
  _SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler::
  CmdBufferRecycler(VkCommandBuffer_T*,VulkanUtilities::VulkanCommandBufferPool__
            (&local_98,vkCmdBuff,this->m_CmdPool);
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
  DiscardResource<Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler,void>
            (this_01,&local_98,msg.field_2._8_8_);
  DisposeVkCmdBuffer::CmdBufferRecycler::~CmdBufferRecycler(&local_98);
  return;
}

Assistant:

void DeviceContextVkImpl::DisposeVkCmdBuffer(SoftwareQueueIndex CmdQueue, VkCommandBuffer vkCmdBuff, Uint64 FenceValue)
{
    VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);
    VERIFY_EXPR(m_CmdPool != nullptr);
    class CmdBufferRecycler
    {
    public:
        // clang-format off
        CmdBufferRecycler(VkCommandBuffer                           _vkCmdBuff,
                         VulkanUtilities::VulkanCommandBufferPool& _Pool) noexcept :
            vkCmdBuff {_vkCmdBuff},
            Pool      {&_Pool    }
        {
            VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);
        }

        CmdBufferRecycler             (const CmdBufferRecycler&)  = delete;
        CmdBufferRecycler& operator = (const CmdBufferRecycler&)  = delete;
        CmdBufferRecycler& operator = (      CmdBufferRecycler&&) = delete;

        CmdBufferRecycler(CmdBufferRecycler&& rhs) noexcept :
            vkCmdBuff {rhs.vkCmdBuff},
            Pool      {rhs.Pool     }
        {
            rhs.vkCmdBuff = VK_NULL_HANDLE;
            rhs.Pool      = nullptr;
        }
        // clang-format on

        ~CmdBufferRecycler()
        {
            if (Pool != nullptr)
            {
                Pool->RecycleCommandBuffer(std::move(vkCmdBuff));
            }
        }

    private:
        VkCommandBuffer                           vkCmdBuff = VK_NULL_HANDLE;
        VulkanUtilities::VulkanCommandBufferPool* Pool      = nullptr;
    };

    // Discard command buffer directly to the release queue since we know exactly which queue it was submitted to
    // as well as the associated FenceValue.
    auto& ReleaseQueue = m_pDevice->GetReleaseQueue(CmdQueue);
    ReleaseQueue.DiscardResource(CmdBufferRecycler{vkCmdBuff, *m_CmdPool}, FenceValue);
}